

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_str_insert_text_runes(nk_str *str,int pos,nk_rune *runes,int len)

{
  int len_00;
  ulong uVar1;
  int iVar2;
  nk_glyph glyph;
  char local_34 [4];
  
  iVar2 = 0;
  if ((len != 0 && (runes != (nk_rune *)0x0 && str != (nk_str *)0x0)) && (iVar2 = len, 0 < len)) {
    uVar1 = 0;
    do {
      len_00 = nk_utf_encode(runes[uVar1],local_34,4);
      if (len_00 == 0) {
        return len;
      }
      nk_str_insert_at_rune(str,pos + (int)uVar1,local_34,len_00);
      uVar1 = uVar1 + 1;
    } while ((uint)len != uVar1);
  }
  return iVar2;
}

Assistant:

NK_API int
nk_str_insert_text_runes(struct nk_str *str, int pos, const nk_rune *runes, int len)
{
    int i = 0;
    int byte_len = 0;
    nk_glyph glyph;

    NK_ASSERT(str);
    if (!str || !runes || !len) return 0;
    for (i = 0; i < len; ++i) {
        byte_len = nk_utf_encode(runes[i], glyph, NK_UTF_SIZE);
        if (!byte_len) break;
        nk_str_insert_at_rune(str, pos+i, glyph, byte_len);
    }
    return len;
}